

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<cmValue>(string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,cmValue *args)

{
  string *psVar1;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_38;
  size_t local_28;
  char *pcStack_20;
  size_type local_18;
  pointer local_10;
  
  local_38._M_len = (a->View_)._M_len;
  local_38._M_str = (a->View_)._M_str;
  local_28 = (b->View_)._M_len;
  pcStack_20 = (b->View_)._M_str;
  psVar1 = args->Value;
  if (psVar1 == (string *)0x0) {
    psVar1 = &cmValue::Empty_abi_cxx11_;
  }
  local_10 = (psVar1->_M_dataplus)._M_p;
  local_18 = psVar1->_M_string_length;
  views._M_len = 3;
  views._M_array = &local_38;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}